

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

string * __thiscall
HdmiCecAnalyzerResults::GetNumberString_abi_cxx11_
          (string *__return_storage_ptr__,HdmiCecAnalyzerResults *this,U64 number,int bits)

{
  char str [128];
  allocator local_99;
  char local_98 [136];
  
  AnalyzerHelpers::GetNumberString(number,this->mDisplayBase,bits,local_98,0x80);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string HdmiCecAnalyzerResults::GetNumberString( U64 number, int bits )
{
    const int strLen = 128;
    char str[ strLen ];
    AnalyzerHelpers::GetNumberString( number, mDisplayBase, bits, str, strLen );
    return std::string( str );
}